

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 roundAndPackFloatx80_aarch64
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  floatx80 fVar11;
  
  bVar2 = status->float_rounding_mode;
  iVar7 = (int)CONCAT71(in_register_00000039,roundingPrecision);
  if (iVar7 == 0x40) {
    uVar1 = 0x7ff;
    uVar8 = 0x400;
LAB_005e4373:
    if (4 < bVar2) {
LAB_005e472a:
      abort();
    }
    switch(bVar2) {
    case 1:
      uVar8 = 0;
      if (zSign != '\0') {
        uVar8 = uVar1;
      }
      break;
    case 2:
      uVar8 = 0;
      if (zSign == '\0') {
        uVar8 = uVar1;
      }
      break;
    case 3:
      uVar8 = 0;
    }
    uVar6 = zSig1 != 0 | zSig0;
    if (0xffff8002 < zExp - 0x7ffeU) {
LAB_005e4411:
      if ((uVar1 & uVar6) != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      uVar4 = uVar8 + uVar6;
      if (CARRY8(uVar8,uVar6)) {
        uVar4 = 0x8000000000000000;
      }
      uVar5 = uVar1 + 1;
      if ((uVar1 & uVar6) * 2 != uVar1 + 1) {
        uVar5 = 0;
      }
      if (bVar2 != 0) {
        uVar5 = 0;
      }
      zSig0 = ~(uVar5 | uVar1) & uVar4;
      iVar7 = zExp + (uint)CARRY8(uVar8,uVar6);
      if (zSig0 == 0) {
        iVar7 = 0;
      }
      uVar3 = (uint)zSign * 0x8000 + iVar7;
      goto LAB_005e4556;
    }
    if ((zExp < 0x7fff) && ((zExp != 0x7ffe || (uVar8 <= ~uVar6)))) {
      if (0 < zExp) goto LAB_005e4411;
      if (status->flush_to_zero != '\0') {
        status->float_exception_flags = status->float_exception_flags | 0x80;
        uVar3 = (uint)zSign << 0xf;
        zSig0 = 0;
        goto LAB_005e4556;
      }
      if (1U - zExp < 0x40) {
        uVar4 = (ulong)(uVar6 << ((char)zExp - 1U & 0x3f) != 0) |
                uVar6 >> ((byte)(1U - zExp) & 0x3f);
      }
      else {
        uVar4 = (ulong)(uVar6 != 0);
      }
      uVar5 = uVar4 & uVar1;
      if (~uVar6 < uVar8 && (zExp == 0 && status->float_detect_tininess != '\x01') || uVar5 == 0) {
        if (uVar5 != 0) {
          bVar9 = status->float_exception_flags;
          goto LAB_005e4642;
        }
      }
      else {
        bVar9 = status->float_exception_flags | 0x10;
LAB_005e4642:
        status->float_exception_flags = bVar9 | 0x20;
      }
      uVar6 = uVar1 + 1;
      if (uVar5 * 2 != uVar1 + 1) {
        uVar6 = 0;
      }
      if (bVar2 != 0) {
        uVar6 = 0;
      }
      zSig0 = ~(uVar6 | uVar1) & uVar4 + uVar8;
      uVar3 = (uint)zSign << 0xf | (uint)(uVar4 + uVar8 >> 0x3f);
      goto LAB_005e4556;
    }
    goto LAB_005e44ae;
  }
  if (iVar7 == 0x20) {
    uVar1 = 0xffffffffff;
    uVar8 = 0x8000000000;
    goto LAB_005e4373;
  }
  uVar3 = (uint)bVar2;
  if (4 < uVar3) goto LAB_005e472a;
  switch((ulong)uVar3) {
  default:
    bVar9 = (byte)(zSig1 >> 0x3f);
    break;
  case 1:
    bVar10 = zSign != '\0';
    goto LAB_005e447d;
  case 2:
    bVar10 = zSign == '\0';
LAB_005e447d:
    bVar9 = zSig1 != 0 & bVar10;
    break;
  case 3:
    bVar9 = 0;
  }
  if (zExp - 0x7ffeU < 0xffff8003) {
    if ((0x7ffe < zExp) || (((zSig0 == 0xffffffffffffffff && zExp == 0x7ffe) & bVar9) == 1)) {
      uVar1 = 0;
LAB_005e44ae:
      status->float_exception_flags = status->float_exception_flags | 0x28;
      if (((bVar2 == 3) || (zSign != '\0' && bVar2 == 2)) || (bVar2 == 1 && zSign == '\0')) {
        zSig0 = ~uVar1;
        uVar3 = (uint)zSign << 0xf | 0x7ffe;
      }
      else {
        uVar3 = (uint)zSign << 0xf | 0x7fff;
        zSig0 = 0x8000000000000000;
      }
      goto LAB_005e4556;
    }
    if (zExp < 1) {
      if (1U - zExp < 0x40) {
        uVar8 = (ulong)(zSig1 != 0) | zSig0 << ((char)zExp - 1U & 0x3f);
      }
      else if (zExp == -0x3f) {
        uVar8 = zSig1 != 0 | zSig0;
      }
      else {
        uVar8 = (ulong)(zSig1 != 0 || zSig0 != 0);
      }
      if (((bVar9 & zExp == 0 & status->float_detect_tininess != '\x01' ^ 1 |
           zSig0 != 0xffffffffffffffff) & uVar8 != 0) == 1) {
        bVar2 = status->float_exception_flags | 0x10;
      }
      else {
        if (uVar8 == 0) goto LAB_005e46b3;
        bVar2 = status->float_exception_flags;
      }
      status->float_exception_flags = bVar2 | 0x20;
LAB_005e46b3:
      fVar11 = (floatx80)
               (*(code *)(&DAT_00d6da24 + *(int *)(&DAT_00d6da24 + (ulong)uVar3 * 4)))
                         (&DAT_00d6da24 + *(int *)(&DAT_00d6da24 + (ulong)uVar3 * 4));
      return fVar11;
    }
  }
  if (zSig1 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (bVar9 == 0) {
    if (zSig0 == 0) {
      zExp = 0;
    }
  }
  else if (zSig0 + 1 == 0) {
    zExp = zExp + 1;
    zSig0 = 0x8000000000000000;
  }
  else {
    zSig0 = zSig0 + 1 & ~(ulong)((zSig1 & 0x7fffffffffffffff) == 0 && uVar3 == 0);
  }
  uVar3 = (uint)zSign * 0x8000 + zExp;
LAB_005e4556:
  fVar11._8_4_ = uVar3;
  fVar11.low = zSig0;
  fVar11._12_4_ = 0;
  return fVar11;
}

Assistant:

floatx80 roundAndPackFloatx80(int8_t roundingPrecision, flag zSign,
                              int32_t zExp, uint64_t zSig0, uint64_t zSig1,
                              float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;
    int64_t roundIncrement, roundMask, roundBits;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    if ( roundingPrecision == 80 ) goto precision80;
    if ( roundingPrecision == 64 ) {
        roundIncrement = UINT64_C(0x0000000000000400);
        roundMask = UINT64_C(0x00000000000007FF);
    }
    else if ( roundingPrecision == 32 ) {
        roundIncrement = UINT64_C(0x0000008000000000);
        roundMask = UINT64_C(0x000000FFFFFFFFFF);
    }
    else {
        goto precision80;
    }
    zSig0 |= ( zSig1 != 0 );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : roundMask;
        break;
    case float_round_down:
        roundIncrement = zSign ? roundMask : 0;
        break;
    default:
        abort();
    }
    roundBits = zSig0 & roundMask;
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || ( ( zExp == 0x7FFE ) && ( zSig0 + roundIncrement < zSig0 ) )
           ) {
            goto overflow;
        }
        if ( zExp <= 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloatx80(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ( zSig0 <= zSig0 + roundIncrement );
            shift64RightJamming( zSig0, 1 - zExp, &zSig0 );
            zExp = 0;
            roundBits = zSig0 & roundMask;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundBits) {
                status->float_exception_flags |= float_flag_inexact;
            }
            zSig0 += roundIncrement;
            if ( (int64_t) zSig0 < 0 ) zExp = 1;
            roundIncrement = roundMask + 1;
            if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
                roundMask |= roundIncrement;
            }
            zSig0 &= ~ roundMask;
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig0 += roundIncrement;
    if ( zSig0 < roundIncrement ) {
        ++zExp;
        zSig0 = UINT64_C(0x8000000000000000);
    }
    roundIncrement = roundMask + 1;
    if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
        roundMask |= roundIncrement;
    }
    zSig0 &= ~ roundMask;
    if ( zSig0 == 0 ) zExp = 0;
    return packFloatx80( zSign, zExp, zSig0 );
 precision80:
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig1;
        break;
    case float_round_down:
        increment = zSign && zSig1;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || (    ( zExp == 0x7FFE )
                  && ( zSig0 == UINT64_C(0xFFFFFFFFFFFFFFFF) )
                  && increment
                )
           ) {
            roundMask = 0;
 overflow:
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
               ) {
                return packFloatx80( zSign, 0x7FFE, ~ roundMask );
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( zExp <= 0 ) {
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ! increment
                || ( zSig0 < UINT64_C(0xFFFFFFFFFFFFFFFF) );
            shift64ExtraRightJamming( zSig0, zSig1, 1 - zExp, &zSig0, &zSig1 );
            zExp = 0;
            if (isTiny && zSig1) {
                float_raise(float_flag_underflow, status);
            }
            if (zSig1) {
                status->float_exception_flags |= float_flag_inexact;
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig1 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig1;
                break;
            case float_round_down:
                increment = zSign && zSig1;
                break;
            default:
                abort();
            }
            if ( increment ) {
                ++zSig0;
                zSig0 &=
                    ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
                if ( (int64_t) zSig0 < 0 ) zExp = 1;
            }
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (zSig1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        ++zSig0;
        if ( zSig0 == 0 ) {
            ++zExp;
            zSig0 = UINT64_C(0x8000000000000000);
        }
        else {
            zSig0 &= ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
        }
    }
    else {
        if ( zSig0 == 0 ) zExp = 0;
    }
    return packFloatx80( zSign, zExp, zSig0 );

}